

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O1

void lzham::generate_polar_codes
               (uint num_syms,sym_freq_conflict *pSF,uint8 *pCodesizes,uint *max_code_size_ret)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint auStack_978 [600];
  
  uVar6 = 0;
  uVar3 = 0;
  if (num_syms != 0) {
    uVar7 = num_syms - 1;
    uVar8 = 0;
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar1 = pSF[uVar7].m_freq;
      uVar3 = uVar3 + uVar1;
      iVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = 1 << ((byte)iVar2 & 0x1f);
      auStack_978[uVar8] = uVar4;
      uVar6 = uVar6 + uVar4;
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (num_syms != uVar8);
  }
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  bVar5 = -(uVar3 == 0) | (byte)iVar2;
  uVar4 = 1 << (bVar5 & 0x1f);
  uVar7 = 2 << (bVar5 & 0x1f);
  if (uVar3 <= uVar4) {
    uVar7 = uVar4;
  }
  if (num_syms != 0 && uVar6 < uVar7) {
    uVar8 = 0;
    uVar3 = 0;
    do {
      uVar4 = auStack_978[uVar8] + uVar6;
      if (uVar7 < uVar4) {
        uVar3 = (int)uVar8 + 1;
      }
      else {
        auStack_978[uVar8] = auStack_978[uVar8] * 2;
        uVar6 = uVar4;
      }
    } while (((uVar4 != uVar7) && (uVar4 = (int)uVar8 + 1, uVar8 = (ulong)uVar4, uVar4 < num_syms))
            || ((uVar6 < uVar7 && (uVar8 = (ulong)uVar3, uVar3 < num_syms))));
  }
  uVar6 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  iVar2 = (uVar6 ^ 0xffffffe0) + 0x21;
  if (uVar7 == 0) {
    iVar2 = 0;
  }
  if (num_syms == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = num_syms - 1;
    uVar8 = 0;
    uVar6 = 0;
    do {
      uVar7 = auStack_978[uVar8];
      uVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = ~uVar4 | 0xffffffe0;
      if (uVar7 == 0) {
        uVar4 = 0;
      }
      uVar4 = uVar4 + iVar2;
      if (uVar6 < uVar4) {
        uVar6 = uVar4;
      }
      pCodesizes[pSF[uVar3].m_sym] = (uint8)uVar4;
      uVar8 = uVar8 + 1;
      uVar3 = uVar3 - 1;
    } while (num_syms != uVar8);
  }
  *max_code_size_ret = uVar6;
  return;
}

Assistant:

void generate_polar_codes(uint num_syms, sym_freq* pSF, uint8* pCodesizes, uint& max_code_size_ret)
   {
      int tmp_freq[cPolarMaxSupportedSyms];

      uint orig_total_freq = 0;
      uint cur_total = 0;
      for (uint i = 0; i < num_syms; i++) 
      {
         uint sym_freq = pSF[num_syms - 1 - i].m_freq;
         orig_total_freq += sym_freq;

         uint sym_len = math::total_bits(sym_freq);
         uint adjusted_sym_freq = 1 << (sym_len - 1);
         tmp_freq[i] = adjusted_sym_freq;
         cur_total += adjusted_sym_freq;
      }

      uint tree_total = 1 << (math::total_bits(orig_total_freq) - 1);
      if (tree_total < orig_total_freq)
         tree_total <<= 1;

      uint start_index = 0;
      while ((cur_total < tree_total) && (start_index < num_syms))
      {
         for (uint i = start_index; i < num_syms; i++) 
         {
            uint freq = tmp_freq[i];
            if ((cur_total + freq) <= tree_total) 
            {
               tmp_freq[i] += freq;
               if ((cur_total += freq) == tree_total)
                  break;
            }
            else 
            {
               start_index = i + 1;
            }
         }
      }         

      LZHAM_ASSERT(cur_total == tree_total);

      uint max_code_size = 0;
      const uint tree_total_bits = math::total_bits(tree_total);
      for (uint i = 0; i < num_syms; i++) 
      {
         uint codesize = (tree_total_bits - math::total_bits(tmp_freq[i]));
         max_code_size = LZHAM_MAX(codesize, max_code_size);
         pCodesizes[pSF[num_syms-1-i].m_sym] = static_cast<uint8>(codesize);
      }
      max_code_size_ret = max_code_size;
   }